

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O1

bid_t docio_append_commit_mark(docio_handle *handle,uint64_t doc_offset)

{
  uint32_t uVar1;
  undefined8 *buf;
  bid_t bVar2;
  uint8_t local_30 [16];
  
  buf = (undefined8 *)malloc(0x18);
  local_30[0] = '\0';
  local_30[1] = '\0';
  local_30[2] = '\0';
  local_30[3] = '\0';
  local_30[4] = '\0';
  local_30[5] = '\0';
  local_30[6] = '\0';
  local_30[7] = '\0';
  local_30[8] = '\0';
  local_30[9] = '\0';
  local_30[10] = '\0';
  local_30[0xb] = '\0';
  local_30[0xc] = '\x10';
  local_30[0xd] = '\0';
  local_30[0xe] = '\0';
  local_30[0xf] = '\0';
  uVar1 = get_checksum(local_30,0xc,handle->file->crc_mode);
  *buf = 0;
  buf[1] = (ulong)(uVar1 & 0xff) << 0x28 | 0x1000000000;
  buf[2] = doc_offset >> 0x38 | (doc_offset & 0xff000000000000) >> 0x28 |
           (doc_offset & 0xff0000000000) >> 0x18 | (doc_offset & 0xff00000000) >> 8 |
           (doc_offset & 0xff000000) << 8 | (doc_offset & 0xff0000) << 0x18 |
           (doc_offset & 0xff00) << 0x28 | doc_offset << 0x38;
  bVar2 = docio_append_doc_raw(handle,0x18,buf);
  free(buf);
  return bVar2;
}

Assistant:

bid_t docio_append_commit_mark(struct docio_handle *handle, uint64_t doc_offset)
{
    // Note: should adapt DOCIO_COMMIT_MARK_SIZE if this function is modified.
    uint32_t offset = 0;
    uint64_t docsize;
    uint64_t _doc_offset;
    void *buf;
    bid_t ret_offset;
    struct docio_length length, _length;

    memset(&length, 0, sizeof(struct docio_length));
    length.flag = DOCIO_TXN_COMMITTED;

    docsize = sizeof(struct docio_length) + sizeof(doc_offset);
    buf = (void *)malloc(docsize);

    _length = _docio_length_encode(length);

    // calculate checksum of LENGTH using crc
    _length.checksum = _docio_length_checksum(_length, handle);

    memcpy((uint8_t *)buf + offset, &_length, sizeof(struct docio_length));
    offset += sizeof(struct docio_length);

    // copy doc_offset
    _doc_offset = _endian_encode(doc_offset);
    memcpy((uint8_t *)buf + offset, &_doc_offset, sizeof(_doc_offset));

    ret_offset = docio_append_doc_raw(handle, docsize, buf);
    free(buf);

    return ret_offset;
}